

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  pointer *ppJVar1;
  int *piVar2;
  pointer pJVar3;
  pointer __first;
  pthread_mutex_t *__mutex;
  int iVar4;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *this_00;
  pointer __result;
  pointer pJVar5;
  pointer pJVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *__s;
  JUnitTestMessage *__p;
  void *unaff_R12;
  allocator<char> local_89;
  _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
  *local_88;
  pthread_mutex_t *local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __p = (JUnitTestMessage *)e;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar4 == 0) {
    local_78._M_p = (pointer)&local_68;
    local_80 = (pthread_mutex_t *)&this->mutex;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"exception","");
    if ((e->error_string).field_0.buf[0x17] < '\0') {
      e = (TestCaseException *)(e->error_string).field_0.data.ptr;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)e,&local_89);
    pJVar3 = (this->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pJVar6 = pJVar3[-1].errors.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pJVar6 == pJVar3[-1].errors.
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = (_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 *)std::
                   vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                   ::_M_check_len(&pJVar3[-1].errors,(size_type)e,__s);
      __first = pJVar3[-1].errors.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_58._M_p =
           (pointer)pJVar3[-1].errors.
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ::_M_allocate(this_00,(size_t)e);
      local_88 = this_00;
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)(((long)pJVar6 - (long)__first) + (long)__result),
                 (JUnitTestMessage *)&local_78,&local_50,in_RCX);
      pJVar5 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_S_relocate(__first,pJVar6,__result,(_Tp_alloc_type *)in_RCX);
      pJVar6 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ::_S_relocate(pJVar6,(pointer)local_58._M_p,pJVar5 + 1,(_Tp_alloc_type *)in_RCX);
      if (__first != (pointer)0x0) {
        operator_delete(__first,(long)pJVar3[-1].errors.
                                      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first);
      }
      pJVar3[-1].errors.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      pJVar3[-1].errors.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar6;
      pJVar3[-1].errors.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)local_88;
    }
    else {
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)pJVar6,(JUnitTestMessage *)&local_78,&local_50,in_RCX);
      ppJVar1 = &pJVar3[-1].errors.
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppJVar1 = *ppJVar1 + 1;
    }
    __mutex = local_80;
    piVar2 = &(this->testCaseData).totalErrors;
    *piVar2 = *piVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar7 = std::__throw_system_error(iVar4);
  __cxa_begin_catch(uVar7);
  if (unaff_R12 == (void *)0x0) {
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
    ::destroy<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>
              ((allocator_type *)e,__p);
  }
  else {
    operator_delete(unaff_R12,(long)local_88 * 0x60);
  }
  uVar7 = __cxa_rethrow();
  __cxa_end_catch();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock(local_80);
  _Unwind_Resume(uVar7);
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            testCaseData.addError("exception", e.error_string.c_str());
        }